

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcProduct::~IfcProduct(IfcProduct *this)

{
  ~IfcProduct((IfcProduct *)
              (&(this->super_IfcObject).field_0x0 +
              *(long *)(*(long *)&this->super_IfcObject + -0x18)));
  return;
}

Assistant:

IfcProduct() : Object("IfcProduct") {}